

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_movep(DisasContext_conflict6 *ctx,int enc_dest,int enc_rt,int enc_rs)

{
  int iVar1;
  int iVar2;
  TCGContext_conflict6 *tcg_ctx_00;
  int rt;
  int re;
  int rs;
  int rd;
  TCGContext_conflict6 *tcg_ctx;
  int enc_rs_local;
  int enc_rt_local;
  int enc_dest_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  iVar1 = gen_movep::re_enc[enc_dest];
  iVar2 = gen_movep::rs_rt_enc[enc_rt];
  if (gen_movep::rs_rt_enc[enc_rs] == 0) {
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[gen_movep::rd_enc[enc_dest]],0);
  }
  else {
    tcg_gen_mov_i64_mips64el
              (tcg_ctx_00,tcg_ctx_00->cpu_gpr[gen_movep::rd_enc[enc_dest]],
               tcg_ctx_00->cpu_gpr[gen_movep::rs_rt_enc[enc_rs]]);
  }
  if (iVar2 == 0) {
    tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[iVar1],0);
  }
  else {
    tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[iVar1],tcg_ctx_00->cpu_gpr[iVar2]);
  }
  return;
}

Assistant:

static inline void gen_movep(DisasContext *ctx, int enc_dest, int enc_rt,
                             int enc_rs)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rd, rs, re, rt;
    static const int rd_enc[] = { 5, 5, 6, 4, 4, 4, 4, 4 };
    static const int re_enc[] = { 6, 7, 7, 21, 22, 5, 6, 7 };
    static const int rs_rt_enc[] = { 0, 17, 2, 3, 16, 18, 19, 20 };
    rd = rd_enc[enc_dest];
    re = re_enc[enc_dest];
    rs = rs_rt_enc[enc_rs];
    rt = rs_rt_enc[enc_rt];
    if (rs) {
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
    } else {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
    }
    if (rt) {
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[re], tcg_ctx->cpu_gpr[rt]);
    } else {
        tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[re], 0);
    }
}